

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void destroyRootPage(Parse *pParse,int iTable,int iDb)

{
  byte bVar1;
  Vdbe *p;
  Parse *pPVar2;
  uint p2;
  
  p = sqlite3GetVdbe(pParse);
  if (pParse->nTempReg == '\0') {
    p2 = pParse->nMem + 1;
    pParse->nMem = p2;
  }
  else {
    bVar1 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar1;
    p2 = pParse->aTempReg[bVar1];
  }
  if (iTable < 2) {
    sqlite3ErrorMsg(pParse,"corrupt schema");
  }
  sqlite3VdbeAddOp3(p,0x90,iTable,p2,iDb);
  pPVar2 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar2 = pParse;
  }
  pPVar2->mayAbort = '\x01';
  sqlite3NestedParse(pParse,"UPDATE %Q.sqlite_master SET rootpage=%d WHERE #%d AND rootpage=#%d",
                     pParse->db->aDb[iDb].zDbSName,(ulong)(uint)iTable,(ulong)p2,(ulong)p2);
  if (p2 != 0) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = p2;
    }
  }
  return;
}

Assistant:

static void destroyRootPage(Parse *pParse, int iTable, int iDb){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int r1 = sqlite3GetTempReg(pParse);
  if( iTable<2 ) sqlite3ErrorMsg(pParse, "corrupt schema");
  sqlite3VdbeAddOp3(v, OP_Destroy, iTable, r1, iDb);
  sqlite3MayAbort(pParse);
#ifndef SQLITE_OMIT_AUTOVACUUM
  /* OP_Destroy stores an in integer r1. If this integer
  ** is non-zero, then it is the root page number of a table moved to
  ** location iTable. The following code modifies the sqlite_schema table to
  ** reflect this.
  **
  ** The "#NNN" in the SQL is a special constant that means whatever value
  ** is in register NNN.  See grammar rules associated with the TK_REGISTER
  ** token for additional information.
  */
  sqlite3NestedParse(pParse,
     "UPDATE %Q." LEGACY_SCHEMA_TABLE
     " SET rootpage=%d WHERE #%d AND rootpage=#%d",
     pParse->db->aDb[iDb].zDbSName, iTable, r1, r1);
#endif
  sqlite3ReleaseTempReg(pParse, r1);
}